

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::CoshLayerParams::~CoshLayerParams(CoshLayerParams *this)

{
  CoshLayerParams *this_local;
  
  ~CoshLayerParams(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

CoshLayerParams::~CoshLayerParams() {
  // @@protoc_insertion_point(destructor:CoreML.Specification.CoshLayerParams)
  if (GetArenaForAllocation() != nullptr) return;
  SharedDtor();
  _internal_metadata_.Delete<std::string>();
}